

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

Integer * copy_map(int *block,int block_ndim,int *map)

{
  Integer *pIVar1;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  Integer *_ga_map_capi;
  int map_offset;
  int capi_offset;
  int sum;
  int i;
  int d;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_24 = 0;
  local_2c = 0;
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    local_24 = *(int *)(in_RDI + (long)local_1c * 4) + local_24;
  }
  pIVar1 = (Integer *)malloc((long)local_24 << 3);
  local_28 = local_24;
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    local_28 = local_28 - *(int *)(in_RDI + (long)local_1c * 4);
    for (local_20 = 0; local_20 < *(int *)(in_RDI + (long)local_1c * 4); local_20 = local_20 + 1) {
      pIVar1[local_28 + local_20] = (long)(*(int *)(in_RDX + (long)(local_2c + local_20) * 4) + 1);
    }
    local_2c = *(int *)(in_RDI + (long)local_1c * 4) + local_2c;
  }
  return pIVar1;
}

Assistant:

static Integer* copy_map(int block[], int block_ndim, int map[])
{
    int d;
    int i,sum=0,capi_offset=0,map_offset=0;
    Integer *_ga_map_capi;

    for (d=0; d<block_ndim; d++) {
        sum += block[d];
    }

    _ga_map_capi = (Integer*)malloc(sum * sizeof(Integer));

    capi_offset = sum;
    for (d=0; d<block_ndim; d++) {
        capi_offset -= block[d];
        for (i=0; i<block[d]; i++) {
            _ga_map_capi[capi_offset+i] = map[map_offset+i] + 1;
        }
        map_offset += block[d];
    }

    return _ga_map_capi;
}